

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O3

stbi_us * stbi_load_16(char *filename,int *x,int *y,int *comp,int req_comp)

{
  FILE *__stream;
  stbi_us *psVar1;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    stbi__g_failure_reason = "can\'t fopen";
    psVar1 = (stbi_us *)0x0;
  }
  else {
    psVar1 = stbi_load_from_file_16((FILE *)__stream,x,y,comp,req_comp);
    fclose(__stream);
  }
  return psVar1;
}

Assistant:

STBIDEF stbi_us *stbi_load_16(char const *filename, int *x, int *y, int *comp, int req_comp)
{
   FILE *f = stbi__fopen(filename, "rb");
   stbi__uint16 *result;
   if (!f) return (stbi_us *) stbi__errpuc("can't fopen", "Unable to open file");
   result = stbi_load_from_file_16(f,x,y,comp,req_comp);
   fclose(f);
   return result;
}